

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

void vkt::tessellation::beginRenderPass
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,VkRenderPass renderPass,
               VkFramebuffer framebuffer,VkRect2D *renderArea,Vec4 *clearColor)

{
  VkClearValue clearValue;
  VkRenderPassBeginInfo renderPassBeginInfo;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40 [2];
  undefined8 local_38;
  deUint64 local_30;
  deUint64 local_28;
  deInt32 local_20;
  deInt32 dStack_1c;
  deUint32 dStack_18;
  deUint32 dStack_14;
  undefined4 local_10;
  undefined8 *local_8;
  
  local_50 = *(undefined8 *)clearColor->m_data;
  uStack_48 = *(undefined8 *)(clearColor->m_data + 2);
  local_8 = &local_50;
  local_40[0] = 0x2b;
  local_38 = 0;
  local_20 = (renderArea->offset).x;
  dStack_1c = (renderArea->offset).y;
  dStack_18 = (renderArea->extent).width;
  dStack_14 = (renderArea->extent).height;
  local_10 = 1;
  local_30 = renderPass.m_internal;
  local_28 = framebuffer.m_internal;
  (*vk->_vptr_DeviceInterface[0x74])(vk,commandBuffer,local_40,0);
  return;
}

Assistant:

void beginRenderPass (const DeviceInterface&	vk,
					  const VkCommandBuffer		commandBuffer,
					  const VkRenderPass		renderPass,
					  const VkFramebuffer		framebuffer,
					  const VkRect2D&			renderArea,
					  const tcu::Vec4&			clearColor)
{
	const VkClearValue clearValue = makeClearValueColor(clearColor);

	const VkRenderPassBeginInfo renderPassBeginInfo = {
		VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,		// VkStructureType         sType;
		DE_NULL,										// const void*             pNext;
		renderPass,										// VkRenderPass            renderPass;
		framebuffer,									// VkFramebuffer           framebuffer;
		renderArea,										// VkRect2D                renderArea;
		1u,												// uint32_t                clearValueCount;
		&clearValue,									// const VkClearValue*     pClearValues;
	};

	vk.cmdBeginRenderPass(commandBuffer, &renderPassBeginInfo, VK_SUBPASS_CONTENTS_INLINE);
}